

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostBend.cpp
# Opt level: O3

void __thiscall OpenMD::GhostBend::calcForce(GhostBend *this,RealType *angle,bool doParticlePot)

{
  RealType *pRVar1;
  pointer ppAVar2;
  Atom *this_00;
  Atom *pAVar3;
  BendType *pBVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  double dVar9;
  uint i;
  long lVar10;
  long lVar11;
  double *pdVar12;
  uint i_2;
  double *pdVar13;
  long lVar14;
  uint i_17;
  uint i_16;
  long lVar15;
  double (*__return_storage_ptr__) [3];
  double tmp;
  double dVar16;
  double dVar17;
  Vector<double,_3U> v;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result;
  RealType dVdTheta;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_2;
  double local_1e8 [4];
  double local_1c8 [4];
  double local_1a8 [4];
  double local_188 [4];
  double local_168 [10];
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  Vector3d local_f8;
  double local_d8 [4];
  double local_b8 [10];
  double local_68 [4];
  double local_48 [4];
  
  ppAVar2 = (this->super_Bend).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = ppAVar2[1];
  pAVar3 = *ppAVar2;
  lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar11 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar11 + 0x10 + lVar10 * 0x18);
  pdVar12 = (double *)(lVar11 + lVar10 * 0x18);
  local_48[0] = *pdVar12;
  local_48[1] = pdVar12[1];
  lVar10 = (long)(this_00->super_StuntDouble).localIndex_;
  lVar11 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                            ).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this_00->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar11 + 0x10 + lVar10 * 0x18);
  pdVar12 = (double *)(lVar11 + lVar10 * 0x18);
  local_68[0] = *pdVar12;
  local_68[1] = pdVar12[1];
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar11 = 0;
  do {
    local_168[lVar11] = local_48[lVar11] - local_68[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_f8.super_Vector<double,_3U>.data_[2] = local_168[2];
  local_f8.super_Vector<double,_3U>.data_[0] = local_168[0];
  local_f8.super_Vector<double,_3U>.data_[1] = local_168[1];
  Snapshot::wrapVector
            (((this->super_Bend).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             &local_f8);
  dVar9 = 0.0;
  lVar11 = 0;
  do {
    dVar17 = local_f8.super_Vector<double,_3U>.data_[lVar11];
    dVar9 = dVar9 + dVar17 * dVar17;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  __return_storage_ptr__ = (double (*) [3])local_b8;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this_00->super_StuntDouble);
  pdVar12 = local_168;
  local_168[6] = 0.0;
  local_168[7] = 0.0;
  local_168[4] = 0.0;
  local_168[5] = 0.0;
  local_168[2] = 0.0;
  local_168[3] = 0.0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[8] = 0.0;
  lVar11 = 0;
  do {
    lVar10 = 0;
    pdVar13 = pdVar12;
    do {
      *pdVar13 = (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar10];
      lVar10 = lVar10 + 1;
      pdVar13 = pdVar13 + 3;
    } while (lVar10 != 3);
    lVar11 = lVar11 + 1;
    pdVar12 = pdVar12 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar11 != 3);
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 0.0;
  pdVar12 = local_168 + 2;
  lVar11 = 0;
  do {
    local_1e8[lVar11] = *pdVar12;
    lVar11 = lVar11 + 1;
    pdVar12 = pdVar12 + 3;
  } while (lVar11 != 3);
  local_1a8[2] = local_1e8[2];
  local_1a8[0] = local_1e8[0];
  local_1a8[1] = local_1e8[1];
  local_118 = 0.0;
  lVar11 = 0;
  do {
    local_118 = local_118 + local_1a8[lVar11] * local_1a8[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (local_118 < 0.0) {
    local_118 = sqrt(local_118);
  }
  else {
    local_118 = SQRT(local_118);
  }
  dVar17 = 0.0;
  lVar11 = 0;
  do {
    dVar17 = dVar17 + local_f8.super_Vector<double,_3U>.data_[lVar11] * local_1a8[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  dVar17 = dVar17 / (dVar9 * local_118);
  dVar16 = 1.0;
  if ((dVar17 <= 1.0) && (dVar16 = dVar17, dVar17 < -1.0)) {
    dVar16 = -1.0;
  }
  local_110 = 1.0 / dVar9;
  local_108 = acos(dVar16);
  pBVar4 = (this->super_Bend).bendType_;
  pRVar1 = &(this->super_Bend).potential_;
  (*pBVar4->_vptr_BendType[2])(pBVar4,pRVar1,&local_100);
  dVar9 = 1.0 - dVar16 * dVar16;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  local_118 = 1.0 / local_118;
  local_100 = local_100 /
              (double)(~-(ulong)(ABS(dVar9) < 1e-06) & (ulong)dVar9 |
                      -(ulong)(ABS(dVar9) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar11 = 0;
  do {
    local_b8[lVar11] = local_1a8[lVar11] * local_118;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar11 = 0;
  do {
    local_1c8[lVar11] = local_f8.super_Vector<double,_3U>.data_[lVar11] * local_110;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 0.0;
  lVar11 = 0;
  do {
    local_1e8[lVar11] = local_1c8[lVar11] * dVar16;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar11 = 0;
  do {
    local_168[lVar11] = local_b8[lVar11] - local_1e8[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar11 = 0;
  do {
    local_188[lVar11] = local_168[lVar11] * local_110 * local_100;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 0.0;
  lVar11 = 0;
  do {
    local_1e8[lVar11] = local_f8.super_Vector<double,_3U>.data_[lVar11] * local_110;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar11 = 0;
  do {
    local_d8[lVar11] = local_1a8[lVar11] * local_118;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar11 = 0;
  do {
    local_1c8[lVar11] = local_d8[lVar11] * dVar16;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar11 = 0;
  do {
    local_b8[lVar11] = local_1e8[lVar11] - local_1c8[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar11 = 0;
  do {
    local_168[lVar11] = local_b8[lVar11] * local_118 * local_100;
    dVar9 = local_168[0];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  pAVar3 = *(this->super_Bend).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  DVar5 = (pAVar3->super_StuntDouble).storage_;
  pSVar6 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar11 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar10 = lVar11 * 0x18 +
           *(long *)((long)&(pSVar6->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar5);
  lVar14 = 0;
  do {
    *(double *)(lVar10 + lVar14 * 8) = local_188[lVar14] + *(double *)(lVar10 + lVar14 * 8);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  lVar10 = 0;
  do {
    local_188[lVar10] = -local_188[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  DVar7 = (this_00->super_StuntDouble).storage_;
  pSVar8 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar10 = (long)(this_00->super_StuntDouble).localIndex_;
  lVar14 = *(long *)((long)&(pSVar8->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar7) + lVar10 * 0x18;
  lVar15 = 0;
  do {
    *(double *)(lVar14 + lVar15 * 8) = local_188[lVar15] + *(double *)(lVar14 + lVar15 * 8);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar16 = local_1a8[0] * local_168[1];
  dVar17 = local_168[0] * local_1a8[2];
  local_168[0] = local_168[2] * local_1a8[1] - local_1a8[2] * local_168[1];
  local_168[1] = dVar17 - local_1a8[0] * local_168[2];
  local_168[2] = dVar16 - dVar9 * local_1a8[1];
  lVar14 = lVar10 * 0x18 +
           *(long *)((long)&(pSVar8->atomData).torque.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar7);
  lVar15 = 0;
  do {
    *(double *)(lVar14 + lVar15 * 8) = local_168[lVar15] + *(double *)(lVar14 + lVar15 * 8);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  if (doParticlePot) {
    lVar14 = *(long *)((long)&(pSVar6->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar5);
    *(double *)(lVar14 + lVar11 * 8) = *pRVar1 + *(double *)(lVar14 + lVar11 * 8);
    lVar11 = *(long *)((long)&(pSVar8->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar7);
    *(double *)(lVar11 + lVar10 * 8) = *pRVar1 + *(double *)(lVar11 + lVar10 * 8);
  }
  *angle = (local_108 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void GhostBend::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[1]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    // we need the transpose of A to get the lab fixed vector:
    Vector3d r23 = ghostAtom->getA().transpose().getColumn(2);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero

    atoms_[0]->addFrc(force1);
    ghostAtom->addFrc(-force1);

    ghostAtom->addTrq(cross(r23, force3));
    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }